

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O1

void __thiscall
glu::sl::ShaderParser::parseShaderCase
          (ShaderParser *this,
          vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *shaderNodeList)

{
  string *__rhs;
  Token TVar1;
  pointer pcVar2;
  ShaderCaseFactory *pSVar3;
  pointer pbVar4;
  pointer pbVar5;
  pointer pbVar6;
  pointer pbVar7;
  pointer pbVar8;
  pointer pRVar9;
  pointer pbVar10;
  pointer pbVar11;
  pointer pbVar12;
  pointer pbVar13;
  pointer pbVar14;
  pointer pbVar15;
  pointer pbVar16;
  pointer pbVar17;
  pointer pbVar18;
  pointer pbVar19;
  pointer pRVar20;
  pointer pRVar21;
  ExpectResult EVar22;
  GLSLVersion GVar23;
  pointer pPVar24;
  pointer pPVar25;
  pointer pPVar26;
  int iVar27;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined8 extraout_RAX;
  RequiredCapability *__args;
  long lVar28;
  ulong uVar29;
  ShaderParser *pSVar30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  void *pvVar31;
  char cVar32;
  ExpectResult expectResult;
  GLSLVersion version;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string caseName;
  vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_> requiredExts;
  vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_> requiredCaps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  geometrySources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tessellationEvalSources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tessellationCtrlSources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fragmentSources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vertexSources;
  vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
  pipelinePrograms;
  string bothSource;
  CaseRequirement requirement;
  string description;
  vector<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_> requirements;
  ValueBlock valueBlock;
  ExpectResult local_3b8;
  GLSLVersion local_3b4;
  TestNode *local_3b0 [2];
  undefined1 local_3a0 [16];
  _Alloc_hider local_390;
  size_type local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  _Alloc_hider local_370;
  undefined1 local_368 [32];
  vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_> local_348;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_328;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_308;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_> local_288;
  undefined1 *local_270;
  long local_268;
  undefined1 local_260;
  undefined7 uStack_25f;
  undefined1 local_250 [8];
  undefined1 local_248 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> local_220;
  vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> local_208;
  vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> local_1f0;
  vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_> local_1d8;
  undefined1 local_1c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1b0;
  vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> local_190;
  vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> vStack_178;
  vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> local_160;
  vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_> vStack_148;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_130;
  undefined1 local_110 [24];
  bool bStack_f8;
  undefined1 local_f0 [32];
  ulong local_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8;
  undefined7 uStack_b7;
  vector<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_> local_a8;
  ValueBlock local_88;
  TestNode *local_38;
  
  local_370._M_p = (pointer)shaderNodeList;
  assumeToken(this,TOKEN_CASE);
  advanceToken(this);
  local_390._M_p = (pointer)&local_380;
  pcVar2 = (this->m_curTokenStr)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_390,pcVar2,pcVar2 + (this->m_curTokenStr)._M_string_length);
  advanceToken(this);
  __rhs = &this->m_curTokenStr;
  local_3b4 = GLSL_VERSION_100_ES;
  local_3b8 = EXPECT_PASS;
  local_c8 = &local_b8;
  local_c0 = 0;
  local_b8 = 0;
  local_270 = &local_260;
  local_268 = 0;
  local_260 = 0;
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_308.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_308.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_308.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.uniforms.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.uniforms.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.uniforms.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0 = 0;
  local_288.
  super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_288.
  super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.
  super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
LAB_0056ce5e:
  do {
    TVar1 = this->m_curToken;
    switch(TVar1) {
    case TOKEN_VERSION:
      advanceToken(this);
      parseGLSLVersion(this,&local_3b4);
      break;
    case TOKEN_TESSELLATION_CONTROL:
    case TOKEN_TESSELLATION_EVALUATION:
    case TOKEN_GEOMETRY:
switchD_0056ce72_caseD_2f:
      local_1c0._0_8_ = &bStack_1b0;
      local_1c0._8_8_ = (pointer)0x0;
      bStack_1b0._M_dataplus._M_p._0_4_ = bStack_1b0._M_dataplus._M_p._0_4_ & 0xffffff00;
      advanceToken(this);
      pSVar30 = (ShaderParser *)0x3;
      assumeToken(this,TOKEN_SHADER_SOURCE);
      parseShaderSource_abi_cxx11_((string *)local_250,pSVar30,(__rhs->_M_dataplus)._M_p);
      std::__cxx11::string::operator=((string *)local_1c0,(string *)local_250);
      if (local_250 != (undefined1  [8])(local_248 + 8)) {
        operator_delete((void *)local_250,local_248._8_8_ + 1);
      }
      advanceToken(this);
      if ((int)TVar1 < 0x2f) {
        if (TVar1 != TOKEN_BOTH) {
          this_00 = &local_2a8;
          if (TVar1 != TOKEN_VERTEX) {
            if (TVar1 != TOKEN_FRAGMENT) goto LAB_0056de17;
            this_00 = &local_2c8;
          }
          goto LAB_0056d11f;
        }
        if (local_268 != 0) {
          local_250 = (undefined1  [8])(local_248 + 8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_250,"multiple \'both\' blocks","");
          parseError(this,(string *)local_250);
LAB_0056de17:
          local_250 = (undefined1  [8])(local_248 + 8);
          std::__throw_logic_error("basic_string::_M_construct null not valid");
          goto switchD_0056ce72_caseD_33;
        }
        std::__cxx11::string::_M_assign((string *)&local_270);
      }
      else {
        if (TVar1 == TOKEN_TESSELLATION_CONTROL) {
          this_00 = &local_2e8;
        }
        else if (TVar1 == TOKEN_TESSELLATION_EVALUATION) {
          this_00 = &local_308;
        }
        else {
          if (TVar1 != TOKEN_GEOMETRY) goto LAB_0056de17;
          this_00 = &local_328;
        }
LAB_0056d11f:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(this_00,(value_type *)local_1c0);
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._0_8_ !=
          &bStack_1b0) {
        operator_delete((void *)local_1c0._0_8_,
                        CONCAT44(bStack_1b0._M_dataplus._M_p._4_4_,bStack_1b0._M_dataplus._M_p._0_4_
                                ) + 1);
      }
      break;
    case TOKEN_REQUIRE:
      local_1c0._0_4_ = 3;
      bStack_1b0._M_string_length._0_4_ = 0;
      bStack_1b0._M_string_length._4_4_ = 0;
      bStack_1b0.field_2._M_allocated_capacity._0_4_ = 0;
      local_1c0._8_8_ = (pointer)0x0;
      bStack_1b0._M_dataplus._M_p._0_4_ = 0;
      bStack_1b0._M_dataplus._M_p._4_4_ = 0;
      bStack_1b0.field_2._M_local_buf[8] = '\0';
      bStack_1b0.field_2._9_7_ = 0;
      parseRequirement(this,(CaseRequirement *)local_1c0);
      std::vector<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_>::push_back
                (&local_a8,(value_type *)local_1c0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_1c0 + 8));
      break;
    case TOKEN_IN:
    case TOKEN_IMPORT:
switchD_0056ce72_caseD_33:
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
                     "unexpected token while parsing shader case: ",__rhs);
      parseError(this,(string *)local_1c0);
LAB_0056de5a:
      local_1c0._0_8_ = &bStack_1b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c0,"\'both\' cannot be mixed with other shader stages","");
      parseError(this,(string *)local_1c0);
LAB_0056de90:
      local_1c0._0_8_ = &bStack_1b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c0,"pipeline programs cannot be mixed with complete programs","");
      parseError(this,(string *)local_1c0);
LAB_0056dec6:
      local_1c0._0_8_ = &bStack_1b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c0,"multiple value blocks","");
      parseError(this,(string *)local_1c0);
LAB_0056defc:
      local_1c0._0_8_ = &bStack_1b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c0,
                 "global extension requirements cannot be mixed with pipeline programs","");
      parseError(this,(string *)local_1c0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._0_8_ !=
          &bStack_1b0) {
        operator_delete((void *)local_1c0._0_8_,
                        CONCAT44(bStack_1b0._M_dataplus._M_p._4_4_,bStack_1b0._M_dataplus._M_p._0_4_
                                ) + 1);
      }
      std::vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>::~vector
                ((vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_> *)
                 local_368);
      if (local_348.
          super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_348.
                        super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_348.
                              super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_348.
                              super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
      ~vector(&local_288);
      std::vector<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_>::~vector
                (&local_a8);
      ValueBlock::~ValueBlock(&local_88);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_328);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_308);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2c8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2a8);
      if (local_270 != &local_260) {
        operator_delete(local_270,CONCAT71(uStack_25f,local_260) + 1);
      }
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_p != &local_380) {
        operator_delete(local_390._M_p,local_380._M_allocated_capacity + 1);
      }
      _Unwind_Resume(extraout_RAX);
    case TOKEN_PIPELINE_PROGRAM:
      local_110[0x10] = 0;
      stack0xffffffffffffff01 = 0;
      local_110._0_8_ = (pointer)0x0;
      local_110[8] = 0;
      local_110._9_7_ = 0;
      memset((ProgramSpecification *)local_1c0,0,0xac);
      local_f0._0_8_ = (pointer)0x0;
      local_f0._8_4_ = 0;
      local_f0._12_4_ = 0;
      local_f0._16_4_ = 0;
      local_f0._20_8_ = 0;
      parsePipelineProgram(this,(ProgramSpecification *)local_1c0);
      bStack_f8 = true;
      std::vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
      push_back(&local_288,(ProgramSpecification *)local_1c0);
      std::vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>::~vector
                ((vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_> *)
                 local_f0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_110);
      std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
                (&local_130);
      lVar28 = 0x78;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1c0 + lVar28));
        lVar28 = lVar28 + -0x18;
      } while (lVar28 != -0x18);
      break;
    default:
      if (8 < TVar1 - TOKEN_DESC) goto switchD_0056ce72_caseD_33;
      switch(TVar1) {
      case TOKEN_DESC:
        advanceToken(this);
        pSVar30 = (ShaderParser *)0x2;
        assumeToken(this,TOKEN_STRING);
        parseStringLiteral_abi_cxx11_((string *)local_1c0,pSVar30,(__rhs->_M_dataplus)._M_p);
        std::__cxx11::string::operator=((string *)&local_c8,(string *)local_1c0);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0._0_8_ !=
            &bStack_1b0) {
          operator_delete((void *)local_1c0._0_8_,
                          CONCAT44(bStack_1b0._M_dataplus._M_p._4_4_,
                                   bStack_1b0._M_dataplus._M_p._0_4_) + 1);
        }
        advanceToken(this);
        break;
      case TOKEN_EXPECT:
        advanceToken(this);
        parseExpectResult(this,&local_3b8);
        break;
      case TOKEN_GROUP:
      case TOKEN_CASE:
        goto switchD_0056ce72_caseD_33;
      case TOKEN_END:
        assumeToken(this,TOKEN_END);
        advanceToken(this);
        local_348.
        super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_348.
        super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
        ._M_impl.super__Vector_impl_data._M_finish = (RequiredCapability *)0x0;
        cVar32 = '\0';
        local_348.
        super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (RequiredCapability *)0x0;
        local_368._16_8_ = (pointer)0x0;
        local_368._0_8_ = (pointer)0x0;
        local_368._8_8_ = (pointer)0x0;
        if (local_a8.
            super__Vector_base<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_a8.
            super__Vector_base<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          lVar28 = 0x28;
          uVar29 = 0;
          cVar32 = '\0';
          do {
            iVar27 = *(int *)((long)local_a8.
                                    super__Vector_base<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar28 + -0x28);
            if (iVar27 == 2) {
              __args = (RequiredCapability *)
                       ((long)&(local_a8.
                                super__Vector_base<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_>
                                ._M_impl.super__Vector_impl_data._M_start)->type + lVar28);
              if (local_348.
                  super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_348.
                  super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<glu::sl::RequiredCapability,std::allocator<glu::sl::RequiredCapability>>
                ::_M_realloc_insert<glu::sl::RequiredCapability_const&>
                          ((vector<glu::sl::RequiredCapability,std::allocator<glu::sl::RequiredCapability>>
                            *)&local_348,
                           (iterator)
                           local_348.
                           super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
                           ._M_impl.super__Vector_impl_data._M_finish,__args);
              }
              else {
                *local_348.
                 super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
                 ._M_impl.super__Vector_impl_data._M_finish = *__args;
                local_348.
                super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_348.
                     super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
            else if (iVar27 == 1) {
              cVar32 = '\x01';
            }
            else if (iVar27 == 0) {
              std::vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>::
              push_back((vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
                         *)local_368,
                        (value_type *)
                        ((long)local_a8.
                               super__Vector_base<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar28 + -0x20));
            }
            uVar29 = uVar29 + 1;
            lVar28 = lVar28 + 0x30;
          } while (uVar29 < (ulong)(((long)local_a8.
                                           super__Vector_base<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_a8.
                                           super__Vector_base<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 4) *
                                   -0x5555555555555555));
        }
        GVar23 = local_3b4;
        EVar22 = local_3b8;
        if (local_268 != 0) {
          if (((local_2a8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                local_2a8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) &&
              (local_2c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               local_2c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)) &&
             ((local_2e8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               local_2e8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish &&
              (((local_308.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start ==
                 local_308.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish &&
                (local_328.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start ==
                 local_328.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)) &&
               (local_288.
                super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                local_288.
                super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                ._M_impl.super__Vector_impl_data._M_finish)))))) {
            bStack_1b0.field_2._M_allocated_capacity._0_4_ = 0;
            bStack_1b0.field_2._M_allocated_capacity._4_4_ = 0;
            bStack_1b0._M_dataplus._M_p._0_4_ = 0;
            bStack_1b0._M_dataplus._M_p._4_4_ = 0;
            bStack_1b0._M_string_length._0_4_ = 0;
            bStack_1b0._M_string_length._4_4_ = 0;
            local_190.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_190.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_190.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            vStack_178.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            vStack_178.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            vStack_178.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_160.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_160.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_160.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            vStack_148.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            vStack_148.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            vStack_148.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_1c0._4_4_ = local_3b8;
            local_1c0._0_4_ = 1;
            local_1c0._8_4_ = local_3b4;
            bStack_1b0.field_2._M_local_buf[8] = cVar32;
            std::vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>::
            operator=((vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
                       *)&bStack_1b0,&local_348);
            std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator=
                      (&local_190,&local_88.inputs);
            std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator=
                      (&vStack_178,&local_88.outputs);
            std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator=
                      (&local_160,&local_88.uniforms);
            std::
            vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
            resize(&vStack_148,1);
            pPVar24 = vStack_148.
                      super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_250 = (undefined1  [8])((ulong)(uint)local_250._4_4_ << 0x20);
            local_248._0_8_ = &local_238;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_248,local_270,local_270 + local_268);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((pPVar24->sources).sources + ((ulong)local_250 & 0xffffffff),
                        (value_type *)local_248);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._0_8_ != &local_238) {
              operator_delete((void *)local_248._0_8_,local_238._0_8_ + 1);
            }
            std::vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>::
            operator=(&(vStack_148.
                        super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                        ._M_impl.super__Vector_impl_data._M_start)->requiredExtensions,
                      (vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
                       *)local_368);
            pSVar3 = this->m_caseFactory;
            local_3b0[0] = (TestNode *)local_3a0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_3b0,local_390._M_p,local_390._M_p + local_388);
            std::__cxx11::string::append((char *)local_3b0);
            ShaderCaseSpecification::ShaderCaseSpecification
                      ((ShaderCaseSpecification *)local_250,(ShaderCaseSpecification *)local_1c0);
            iVar27 = (*pSVar3->_vptr_ShaderCaseFactory[1])(pSVar3,local_3b0,&local_c8,local_250);
            local_38 = (TestNode *)CONCAT44(extraout_var,iVar27);
            std::vector<tcu::TestNode*,std::allocator<tcu::TestNode*>>::emplace_back<tcu::TestNode*>
                      ((vector<tcu::TestNode*,std::allocator<tcu::TestNode*>> *)local_370._M_p,
                       &local_38);
            std::
            vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
            ~vector(&local_1d8);
            std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector(&local_1f0);
            std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector(&local_208);
            std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector(&local_220);
            if ((void *)local_248._8_8_ != (void *)0x0) {
              operator_delete((void *)local_248._8_8_,local_238._8_8_ - local_248._8_8_);
            }
            if (local_3b0[0] != (TestNode *)local_3a0) {
              operator_delete(local_3b0[0],local_3a0._0_8_ + 1);
            }
            std::
            vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
            ~vector(&vStack_148);
            std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector(&local_160);
            std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector(&vStack_178);
            std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector(&local_190);
            pvVar31 = (void *)CONCAT44(bStack_1b0._M_dataplus._M_p._4_4_,
                                       bStack_1b0._M_dataplus._M_p._0_4_);
            if (pvVar31 != (void *)0x0) {
              operator_delete(pvVar31,CONCAT44(bStack_1b0.field_2._M_allocated_capacity._4_4_,
                                               bStack_1b0.field_2._M_allocated_capacity._0_4_) -
                                      (long)pvVar31);
            }
            bStack_1b0.field_2._M_allocated_capacity._0_4_ = 0;
            bStack_1b0.field_2._M_allocated_capacity._4_4_ = 0;
            bStack_1b0._M_dataplus._M_p._0_4_ = 0;
            bStack_1b0._M_dataplus._M_p._4_4_ = 0;
            bStack_1b0._M_string_length._0_4_ = 0;
            bStack_1b0._M_string_length._4_4_ = 0;
            local_190.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_190.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_190.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            vStack_178.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            vStack_178.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            vStack_178.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_160.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_160.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_160.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            vStack_148.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            vStack_148.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            vStack_148.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_1c0._4_4_ = EVar22;
            local_1c0._0_4_ = 2;
            local_1c0._8_4_ = GVar23;
            bStack_1b0.field_2._M_local_buf[8] = cVar32;
            std::vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>::
            operator=((vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
                       *)&bStack_1b0,&local_348);
            std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator=
                      (&local_190,&local_88.inputs);
            std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator=
                      (&vStack_178,&local_88.outputs);
            std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator=
                      (&local_160,&local_88.uniforms);
            std::
            vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
            resize(&vStack_148,1);
            pPVar24 = vStack_148.
                      super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_250._0_4_ = 1;
            local_248._0_8_ = &local_238;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_248,local_270,local_270 + local_268);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((pPVar24->sources).sources + ((ulong)local_250 & 0xffffffff),
                        (value_type *)local_248);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._0_8_ != &local_238) {
              operator_delete((void *)local_248._0_8_,local_238._0_8_ + 1);
            }
            std::vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>::
            operator=(&(vStack_148.
                        super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                        ._M_impl.super__Vector_impl_data._M_start)->requiredExtensions,
                      (vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
                       *)local_368);
            pSVar3 = this->m_caseFactory;
            local_3b0[0] = (TestNode *)local_3a0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_3b0,local_390._M_p,local_390._M_p + local_388);
            std::__cxx11::string::append((char *)local_3b0);
            ShaderCaseSpecification::ShaderCaseSpecification
                      ((ShaderCaseSpecification *)local_250,(ShaderCaseSpecification *)local_1c0);
            iVar27 = (*pSVar3->_vptr_ShaderCaseFactory[1])(pSVar3,local_3b0,&local_c8,local_250);
            local_38 = (TestNode *)CONCAT44(extraout_var_00,iVar27);
            std::vector<tcu::TestNode*,std::allocator<tcu::TestNode*>>::emplace_back<tcu::TestNode*>
                      ((vector<tcu::TestNode*,std::allocator<tcu::TestNode*>> *)local_370._M_p,
                       &local_38);
            std::
            vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
            ~vector(&local_1d8);
            std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector(&local_1f0);
            std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector(&local_208);
            std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector(&local_220);
            if ((void *)local_248._8_8_ != (void *)0x0) {
              operator_delete((void *)local_248._8_8_,local_238._8_8_ - local_248._8_8_);
            }
            if (local_3b0[0] != (TestNode *)local_3a0) {
              operator_delete(local_3b0[0],local_3a0._0_8_ + 1);
            }
            std::
            vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
            ~vector(&vStack_148);
            std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector(&local_160);
            std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector(&vStack_178);
            std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector(&local_190);
            pvVar31 = (void *)CONCAT44(bStack_1b0._M_dataplus._M_p._4_4_,
                                       bStack_1b0._M_dataplus._M_p._0_4_);
            goto LAB_0056dcae;
          }
          goto LAB_0056de5a;
        }
        if (local_288.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_288.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          bStack_1b0.field_2._M_allocated_capacity._0_4_ = 0;
          bStack_1b0.field_2._M_allocated_capacity._4_4_ = 0;
          bStack_1b0._M_dataplus._M_p._0_4_ = 0;
          bStack_1b0._M_dataplus._M_p._4_4_ = 0;
          bStack_1b0._M_string_length._0_4_ = 0;
          bStack_1b0._M_string_length._4_4_ = 0;
          local_190.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_190.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_190.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          vStack_178.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          vStack_178.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_178.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_160.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_160.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_160.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          vStack_148.
          super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          vStack_148.
          super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_148.
          super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_1c0._0_8_ = (ulong)local_3b8 << 0x20;
          local_1c0._8_4_ = local_3b4;
          bStack_1b0.field_2._M_local_buf[8] = cVar32;
          std::vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>::
          operator=((vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
                     *)&bStack_1b0,&local_348);
          std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator=
                    (&local_190,&local_88.inputs);
          std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator=
                    (&vStack_178,&local_88.outputs);
          std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator=
                    (&local_160,&local_88.uniforms);
          std::vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ::resize(&vStack_148,1);
          pbVar10 = ((vStack_148.
                      super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar11 = ((vStack_148.
                      super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pbVar4 = ((vStack_148.
                     super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                     ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          ((vStack_148.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_2a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          ((vStack_148.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_2a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          ((vStack_148.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_2a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pbVar12 = ((vStack_148.
                      super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start)->sources).sources[1].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar13 = ((vStack_148.
                      super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start)->sources).sources[1].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pbVar5 = ((vStack_148.
                     super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                     ._M_impl.super__Vector_impl_data._M_start)->sources).sources[1].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          ((vStack_148.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_start)->sources).sources[1].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_2c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          ((vStack_148.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_start)->sources).sources[1].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_2c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          ((vStack_148.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_start)->sources).sources[1].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_2c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pbVar14 = ((vStack_148.
                      super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start)->sources).sources[3].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar15 = ((vStack_148.
                      super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start)->sources).sources[3].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pbVar6 = ((vStack_148.
                     super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                     ._M_impl.super__Vector_impl_data._M_start)->sources).sources[3].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          ((vStack_148.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_start)->sources).sources[3].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_2e8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          ((vStack_148.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_start)->sources).sources[3].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_2e8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          ((vStack_148.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_start)->sources).sources[3].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_2e8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pbVar16 = ((vStack_148.
                      super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start)->sources).sources[4].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar17 = ((vStack_148.
                      super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start)->sources).sources[4].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pbVar7 = ((vStack_148.
                     super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                     ._M_impl.super__Vector_impl_data._M_start)->sources).sources[4].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          ((vStack_148.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_start)->sources).sources[4].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_308.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          ((vStack_148.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_start)->sources).sources[4].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_308.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          ((vStack_148.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_start)->sources).sources[4].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_308.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pbVar18 = ((vStack_148.
                      super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start)->sources).sources[2].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar19 = ((vStack_148.
                      super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start)->sources).sources[2].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pbVar8 = ((vStack_148.
                     super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                     ._M_impl.super__Vector_impl_data._M_start)->sources).sources[2].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          ((vStack_148.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_start)->sources).sources[2].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_328.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          ((vStack_148.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_start)->sources).sources[2].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_328.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          ((vStack_148.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_start)->sources).sources[2].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_328.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pRVar20 = ((vStack_148.
                      super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start)->requiredExtensions).
                    super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pRVar21 = ((vStack_148.
                      super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start)->requiredExtensions).
                    super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pRVar9 = ((vStack_148.
                     super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                     ._M_impl.super__Vector_impl_data._M_start)->requiredExtensions).
                   super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          ((vStack_148.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_start)->requiredExtensions).
          super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_368._0_8_;
          ((vStack_148.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_start)->requiredExtensions).
          super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_368._8_8_;
          ((vStack_148.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_start)->requiredExtensions).
          super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_368._16_8_;
          pSVar3 = this->m_caseFactory;
          local_368._0_8_ = pRVar20;
          local_368._8_8_ = pRVar21;
          local_368._16_8_ = pRVar9;
          local_328.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = pbVar18;
          local_328.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar19;
          local_328.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar8;
          local_308.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = pbVar16;
          local_308.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar17;
          local_308.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar7;
          local_2e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = pbVar14;
          local_2e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar15;
          local_2e8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar6;
          local_2c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = pbVar12;
          local_2c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar13;
          local_2c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar5;
          local_2a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = pbVar10;
          local_2a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar11;
          local_2a8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar4;
          ShaderCaseSpecification::ShaderCaseSpecification
                    ((ShaderCaseSpecification *)local_250,(ShaderCaseSpecification *)local_1c0);
          iVar27 = (*pSVar3->_vptr_ShaderCaseFactory[1])(pSVar3,&local_390,&local_c8,local_250);
          local_3b0[0] = (TestNode *)CONCAT44(extraout_var_02,iVar27);
          std::vector<tcu::TestNode*,std::allocator<tcu::TestNode*>>::emplace_back<tcu::TestNode*>
                    ((vector<tcu::TestNode*,std::allocator<tcu::TestNode*>> *)local_370._M_p,
                     local_3b0);
          std::vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ::~vector(&local_1d8);
          std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector(&local_1f0);
          std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector(&local_208);
          std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector(&local_220);
          if ((void *)local_248._8_8_ != (void *)0x0) {
            operator_delete((void *)local_248._8_8_,local_238._8_8_ - local_248._8_8_);
          }
LAB_0056dc80:
          std::vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ::~vector(&vStack_148);
          std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector(&local_160);
          std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector(&vStack_178);
          std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector(&local_190);
          pvVar31 = (void *)CONCAT44(bStack_1b0._M_dataplus._M_p._4_4_,
                                     bStack_1b0._M_dataplus._M_p._0_4_);
LAB_0056dcae:
          if (pvVar31 != (void *)0x0) {
            operator_delete(pvVar31,CONCAT44(bStack_1b0.field_2._M_allocated_capacity._4_4_,
                                             bStack_1b0.field_2._M_allocated_capacity._0_4_) -
                                    (long)pvVar31);
          }
          std::vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>::
          ~vector((vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_> *
                  )local_368);
          if (local_348.
              super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_348.
                            super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_348.
                                  super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_348.
                                  super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          std::vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ::~vector(&local_288);
          std::vector<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_>::~vector
                    (&local_a8);
          std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector(&local_88.uniforms);
          std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector(&local_88.outputs);
          std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector(&local_88.inputs);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_328);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_308);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_2e8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_2c8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_2a8);
          if (local_270 != &local_260) {
            operator_delete(local_270,CONCAT71(uStack_25f,local_260) + 1);
          }
          if (local_c8 != &local_b8) {
            operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_390._M_p != &local_380) {
            operator_delete(local_390._M_p,local_380._M_allocated_capacity + 1);
          }
          return;
        }
        if ((((local_2a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               local_2a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) &&
             (local_2c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_2c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)) &&
            (local_2e8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             local_2e8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)) &&
           ((local_308.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             local_308.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish &&
            (local_328.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             local_328.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)))) {
          if (local_368._0_8_ != local_368._8_8_) goto LAB_0056defc;
          bStack_1b0.field_2._M_allocated_capacity._0_4_ = 0;
          bStack_1b0.field_2._M_allocated_capacity._4_4_ = 0;
          bStack_1b0._M_dataplus._M_p._0_4_ = 0;
          bStack_1b0._M_dataplus._M_p._4_4_ = 0;
          bStack_1b0._M_string_length._0_4_ = 0;
          bStack_1b0._M_string_length._4_4_ = 0;
          local_190.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_190.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_190.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          vStack_178.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          vStack_178.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_178.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_160.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_160.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_160.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          vStack_148.
          super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          vStack_148.
          super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_148.
          super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_1c0._0_8_ = (ulong)local_3b8 << 0x20;
          local_1c0._8_4_ = local_3b4;
          bStack_1b0.field_2._M_local_buf[8] = cVar32;
          std::vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>::
          operator=((vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
                     *)&bStack_1b0,&local_348);
          std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator=
                    (&local_190,&local_88.inputs);
          std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator=
                    (&vStack_178,&local_88.outputs);
          std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator=
                    (&local_160,&local_88.uniforms);
          pPVar26 = vStack_148.
                    super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pPVar25 = vStack_148.
                    super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pPVar24 = vStack_148.
                    super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          vStack_148.
          super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_288.
               super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
               ._M_impl.super__Vector_impl_data._M_start;
          vStack_148.
          super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_288.
               super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          vStack_148.
          super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_288.
               super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_288.
          super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ._M_impl.super__Vector_impl_data._M_start = pPVar24;
          local_288.
          super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ._M_impl.super__Vector_impl_data._M_finish = pPVar25;
          local_288.
          super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pPVar26;
          pSVar3 = this->m_caseFactory;
          ShaderCaseSpecification::ShaderCaseSpecification
                    ((ShaderCaseSpecification *)local_250,(ShaderCaseSpecification *)local_1c0);
          iVar27 = (*pSVar3->_vptr_ShaderCaseFactory[1])(pSVar3,&local_390,&local_c8,local_250);
          local_3b0[0] = (TestNode *)CONCAT44(extraout_var_01,iVar27);
          std::vector<tcu::TestNode*,std::allocator<tcu::TestNode*>>::emplace_back<tcu::TestNode*>
                    ((vector<tcu::TestNode*,std::allocator<tcu::TestNode*>> *)local_370._M_p,
                     local_3b0);
          std::vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ::~vector(&local_1d8);
          std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector(&local_1f0);
          std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector(&local_208);
          std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::~vector(&local_220);
          if ((void *)local_248._8_8_ != (void *)0x0) {
            operator_delete((void *)local_248._8_8_,local_238._8_8_ - local_248._8_8_);
          }
          goto LAB_0056dc80;
        }
        goto LAB_0056de90;
      case TOKEN_VALUES:
        if ((local_d0 & 1) == 0) goto code_r0x0056d163;
        goto LAB_0056dec6;
      default:
        goto switchD_0056ce72_caseD_2f;
      }
    }
  } while( true );
code_r0x0056d163:
  local_d0 = CONCAT71((int7)((ulong)((long)&switchD_0056cea5::switchdataD_00696e08 +
                                    (long)(int)(&switchD_0056cea5::switchdataD_00696e08)
                                               [TVar1 - TOKEN_DESC]) >> 8),1);
  parseValueBlock(this,&local_88);
  goto LAB_0056ce5e;
}

Assistant:

void ShaderParser::parseShaderCase (vector<tcu::TestNode*>& shaderNodeList)
{
	// Parse 'case'.
	PARSE_DBG(("  parseShaderCase()\n"));
	advanceToken(TOKEN_CASE);

	// Parse case name.
	string caseName = m_curTokenStr;
	advanceToken(); // \note [pyry] All token types are allowed here.

	// \todo [pyry] Optimize by parsing most stuff directly to ShaderCaseSpecification

	// Setup case.
	GLSLVersion						version			= DEFAULT_GLSL_VERSION;
	ExpectResult					expectResult	= EXPECT_PASS;
	string							description;
	string							bothSource;
	vector<string>					vertexSources;
	vector<string>					fragmentSources;
	vector<string>					tessellationCtrlSources;
	vector<string>					tessellationEvalSources;
	vector<string>					geometrySources;
	ValueBlock						valueBlock;
	bool							valueBlockSeen	= false;
	vector<CaseRequirement>			requirements;
	vector<ProgramSpecification>	pipelinePrograms;

	for (;;)
	{
		if (m_curToken == TOKEN_END)
			break;
		else if (m_curToken == TOKEN_DESC)
		{
			advanceToken();
			assumeToken(TOKEN_STRING);
			description = parseStringLiteral(m_curTokenStr.c_str());
			advanceToken();
		}
		else if (m_curToken == TOKEN_EXPECT)
		{
			advanceToken();
			parseExpectResult(expectResult);
		}
		else if (m_curToken == TOKEN_VALUES)
		{
			if (valueBlockSeen)
				parseError("multiple value blocks");
			parseValueBlock(valueBlock);
			valueBlockSeen = true;
		}
		else if (m_curToken == TOKEN_BOTH						||
				 m_curToken == TOKEN_VERTEX						||
				 m_curToken == TOKEN_FRAGMENT					||
				 m_curToken == TOKEN_TESSELLATION_CONTROL		||
				 m_curToken == TOKEN_TESSELLATION_EVALUATION	||
				 m_curToken == TOKEN_GEOMETRY)
		{
			const Token	token = m_curToken;
			string		source;

			advanceToken();
			assumeToken(TOKEN_SHADER_SOURCE);
			source = parseShaderSource(m_curTokenStr.c_str());
			advanceToken();

			switch (token)
			{
				case TOKEN_VERTEX:					vertexSources.push_back(source);			break;
				case TOKEN_FRAGMENT:				fragmentSources.push_back(source);			break;
				case TOKEN_TESSELLATION_CONTROL:	tessellationCtrlSources.push_back(source);	break;
				case TOKEN_TESSELLATION_EVALUATION:	tessellationEvalSources.push_back(source);	break;
				case TOKEN_GEOMETRY:				geometrySources.push_back(source);			break;
				case TOKEN_BOTH:
				{
					if (!bothSource.empty())
						parseError("multiple 'both' blocks");
					bothSource = source;
					break;
				}

				default:
					parseError(DE_FALSE);
			}
		}
		else if (m_curToken == TOKEN_VERSION)
		{
			advanceToken();
			parseGLSLVersion(version);
		}
		else if (m_curToken == TOKEN_REQUIRE)
		{
			CaseRequirement requirement;
			parseRequirement(requirement);
			requirements.push_back(requirement);
		}
		else if (m_curToken == TOKEN_PIPELINE_PROGRAM)
		{
			ProgramSpecification pipelineProgram;
			parsePipelineProgram(pipelineProgram);
			pipelineProgram.sources.separable = true;
			pipelinePrograms.push_back(pipelineProgram);
		}
		else
			parseError(string("unexpected token while parsing shader case: " + m_curTokenStr));
	}

	advanceToken(TOKEN_END); // case end

	// \todo [pyry] Clean up
	vector<RequiredCapability>	requiredCaps;
	vector<RequiredExtension>	requiredExts;
	bool						fullGLSLES100Required	= false;

	for (size_t reqNdx = 0; reqNdx < requirements.size(); ++reqNdx)
	{
		const CaseRequirement&	requirement	= requirements[reqNdx];

		if (requirement.type == CaseRequirement::TYPE_EXTENSION)
			requiredExts.push_back(requirement.extension);
		else if (requirement.type == CaseRequirement::TYPE_IMPLEMENTATION_LIMIT)
			requiredCaps.push_back(requirement.requiredCap);
		else if (requirement.type == CaseRequirement::TYPE_FULL_GLSL_ES_100_SUPPORT)
			fullGLSLES100Required = true;
		else
			DE_ASSERT(false);
	}

	if (!bothSource.empty())
	{
		if (!vertexSources.empty()				||
			!fragmentSources.empty()			||
			!tessellationCtrlSources.empty()	||
			!tessellationEvalSources.empty()	||
			!geometrySources.empty()			||
			!pipelinePrograms.empty())
		{
			parseError("'both' cannot be mixed with other shader stages");
		}

		// vertex
		{
			ShaderCaseSpecification	spec;
			spec.caseType				= CASETYPE_VERTEX_ONLY;
			spec.expectResult			= expectResult;
			spec.targetVersion			= version;
			spec.fullGLSLES100Required	= fullGLSLES100Required;
			spec.requiredCaps			= requiredCaps;
			spec.values					= valueBlock;

			spec.programs.resize(1);
			spec.programs[0].sources << VertexSource(bothSource);
			spec.programs[0].requiredExtensions	= requiredExts;

			shaderNodeList.push_back(m_caseFactory->createCase(caseName + "_vertex", description, ShaderCaseSpecification(spec)));
		}

		// fragment
		{
			ShaderCaseSpecification	spec;
			spec.caseType				= CASETYPE_FRAGMENT_ONLY;
			spec.expectResult			= expectResult;
			spec.targetVersion			= version;
			spec.fullGLSLES100Required	= fullGLSLES100Required;
			spec.requiredCaps			= requiredCaps;
			spec.values					= valueBlock;

			spec.programs.resize(1);
			spec.programs[0].sources << FragmentSource(bothSource);
			spec.programs[0].requiredExtensions	= requiredExts;

			shaderNodeList.push_back(m_caseFactory->createCase(caseName + "_fragment", description, ShaderCaseSpecification(spec)));
		}
	}
	else if (pipelinePrograms.empty())
	{
		ShaderCaseSpecification	spec;
		spec.caseType				= CASETYPE_COMPLETE;
		spec.expectResult			= expectResult;
		spec.targetVersion			= version;
		spec.fullGLSLES100Required	= fullGLSLES100Required;
		spec.requiredCaps			= requiredCaps;
		spec.values					= valueBlock;

		spec.programs.resize(1);
		spec.programs[0].sources.sources[SHADERTYPE_VERTEX].swap(vertexSources);
		spec.programs[0].sources.sources[SHADERTYPE_FRAGMENT].swap(fragmentSources);
		spec.programs[0].sources.sources[SHADERTYPE_TESSELLATION_CONTROL].swap(tessellationCtrlSources);
		spec.programs[0].sources.sources[SHADERTYPE_TESSELLATION_EVALUATION].swap(tessellationEvalSources);
		spec.programs[0].sources.sources[SHADERTYPE_GEOMETRY].swap(geometrySources);
		spec.programs[0].requiredExtensions.swap(requiredExts);

		shaderNodeList.push_back(m_caseFactory->createCase(caseName, description, ShaderCaseSpecification(spec)));
	}
	else
	{
		if (!vertexSources.empty()				||
			!fragmentSources.empty()			||
			!tessellationCtrlSources.empty()	||
			!tessellationEvalSources.empty()	||
			!geometrySources.empty())
		{
			parseError("pipeline programs cannot be mixed with complete programs");
		}

		if (!requiredExts.empty())
			parseError("global extension requirements cannot be mixed with pipeline programs");

		// Pipeline case, multiple programs
		{
			ShaderCaseSpecification	spec;
			spec.caseType				= CASETYPE_COMPLETE;
			spec.expectResult			= expectResult;
			spec.targetVersion			= version;
			spec.fullGLSLES100Required	= fullGLSLES100Required;
			spec.requiredCaps			= requiredCaps;
			spec.values					= valueBlock;

			spec.programs.swap(pipelinePrograms);

			shaderNodeList.push_back(m_caseFactory->createCase(caseName, description, ShaderCaseSpecification(spec)));
		}
	}
}